

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

Type __thiscall
ON_MeshParameters::GeometrySettingsType(ON_MeshParameters *this,bool bIgnoreSubDParameters)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double mesh_density;
  ON_SHA1_Hash local_69;
  ON_SHA1_Hash local_55;
  ON_SHA1_Hash local_41;
  undefined1 local_2d [8];
  ON_SHA1_Hash mp_hash;
  bool bIgnoreSubDParameters_local;
  ON_MeshParameters *this_local;
  
  mp_hash.m_digest[0xc] = bIgnoreSubDParameters;
  unique0x1000018a = this;
  GeometrySettingsHash((ON_SHA1_Hash *)local_2d,this,bIgnoreSubDParameters);
  GeometrySettingsHash(&local_41,&DefaultMesh,(bool)(mp_hash.m_digest[0xc] & 1));
  bVar1 = ::operator==((ON_SHA1_Hash *)local_2d,&local_41);
  if (bVar1) {
    this_local._7_1_ = Default;
  }
  else {
    GeometrySettingsHash(&local_55,&FastRenderMesh,(bool)(mp_hash.m_digest[0xc] & 1));
    bVar1 = ::operator==((ON_SHA1_Hash *)local_2d,&local_55);
    if (bVar1) {
      this_local._7_1_ = FastRender;
    }
    else {
      GeometrySettingsHash(&local_69,&QualityRenderMesh,(bool)(mp_hash.m_digest[0xc] & 1));
      bVar1 = ::operator==((ON_SHA1_Hash *)local_2d,&local_69);
      if (bVar1) {
        this_local._7_1_ = QualityRender;
      }
      else {
        GeometrySettingsHash
                  ((ON_SHA1_Hash *)((long)&mesh_density + 3),&DefaultAnalysisMesh,
                   (bool)(mp_hash.m_digest[0xc] & 1));
        bVar1 = ::operator==((ON_SHA1_Hash *)local_2d,(ON_SHA1_Hash *)((long)&mesh_density + 3));
        if (bVar1) {
          this_local._7_1_ = DefaultAnalysis;
        }
        else {
          dVar2 = MeshDensity(this);
          dVar3 = RelativeTolerance(this);
          if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
            this_local._7_1_ = Custom;
          }
          else {
            this_local._7_1_ = FromMeshDensity;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

enum ON_MeshParameters::Type ON_MeshParameters::GeometrySettingsType(bool bIgnoreSubDParameters) const
{
  const ON_SHA1_Hash mp_hash = GeometrySettingsHash(bIgnoreSubDParameters);

  if ( mp_hash == ON_MeshParameters::DefaultMesh.GeometrySettingsHash(bIgnoreSubDParameters))
    return ON_MeshParameters::Type::Default;
  if ( mp_hash == ON_MeshParameters::FastRenderMesh.GeometrySettingsHash(bIgnoreSubDParameters))
    return ON_MeshParameters::Type::FastRender;
  if ( mp_hash == ON_MeshParameters::QualityRenderMesh.GeometrySettingsHash(bIgnoreSubDParameters))
    return ON_MeshParameters::Type::QualityRender;
  if ( mp_hash == ON_MeshParameters::DefaultAnalysisMesh.GeometrySettingsHash(bIgnoreSubDParameters))
    return ON_MeshParameters::Type::DefaultAnalysis;

  const double mesh_density = MeshDensity();
  if (mesh_density == RelativeTolerance())
    return ON_MeshParameters::Type::FromMeshDensity;

  return ON_MeshParameters::Type::Custom;
}